

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-type-util.h
# Opt level: O0

string * __thiscall
testing::internal::GetTypeName_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,type_info *type)

{
  char *local_a0;
  string local_88;
  allocator<char> local_51;
  string local_50 [8];
  string name_str;
  char *readable_name;
  char *pcStack_20;
  int status;
  char *name;
  type_info *type_local;
  
  name = (char *)this;
  type_local = (type_info *)__return_storage_ptr__;
  pcStack_20 = std::type_info::name((type_info *)this);
  readable_name._4_4_ = 0;
  name_str.field_2._8_8_ = __cxa_demangle(pcStack_20,0,0,(long)&readable_name + 4);
  local_a0 = (char *)name_str.field_2._8_8_;
  if (readable_name._4_4_ != 0) {
    local_a0 = pcStack_20;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,local_a0,&local_51);
  std::allocator<char>::~allocator(&local_51);
  free((void *)name_str.field_2._8_8_);
  std::__cxx11::string::string((string *)&local_88,local_50);
  CanonicalizeForStdLibVersioning(__return_storage_ptr__,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetTypeName(const std::type_info& type) {
  const char* const name = type.name();
#if GTEST_HAS_CXXABI_H_ || defined(__HP_aCC)
  int status = 0;
  // gcc's implementation of typeid(T).name() mangles the type name,
  // so we have to demangle it.
#if GTEST_HAS_CXXABI_H_
  using abi::__cxa_demangle;
#endif  // GTEST_HAS_CXXABI_H_
  char* const readable_name = __cxa_demangle(name, nullptr, nullptr, &status);
  const std::string name_str(status == 0 ? readable_name : name);
  free(readable_name);
  return CanonicalizeForStdLibVersioning(name_str);
#elif defined(_MSC_VER)
  // Strip struct and class due to differences between
  // MSVC and other compilers. std::pair<int,bool> is printed as
  // "struct std::pair<int,bool>" when using MSVC vs "std::pair<int, bool>" with
  // other compilers.
  std::string s = name;
  // Only strip the leading "struct " and "class ", so uses rfind == 0 to
  // ensure that
  if (s.rfind("struct ", 0) == 0) {
    s = s.substr(strlen("struct "));
  } else if (s.rfind("class ", 0) == 0) {
    s = s.substr(strlen("class "));
  }
  return s;
#else
  return name;
#endif  // GTEST_HAS_CXXABI_H_ || __HP_aCC
}